

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::blockCurrentSol(Engine *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Lit LVar5;
  Clause *pCVar6;
  Branching **ppBVar7;
  Lit *pLVar8;
  long in_RDI;
  Var *v;
  uint i;
  bool root_failure;
  Clause *c;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffd0;
  Lit in_stack_ffffffffffffffd4;
  uint local_18;
  
  vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x10));
  pCVar6 = ::Reason_new(in_stack_ffffffffffffffc4);
  bVar1 = true;
  local_18 = 0;
  while( true ) {
    uVar9 = local_18;
    uVar3 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x10));
    if (uVar3 <= uVar9) break;
    ppBVar7 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x10),local_18);
    iVar4 = (*(*ppBVar7)->_vptr_Branching[3])();
    if (iVar4 == 0) {
      vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x10),local_18);
      LVar5 = BoolView::getValLit((BoolView *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      pLVar8 = Clause::operator[]((Clause *)CONCAT44(uVar9,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffbc);
      pLVar8->x = LVar5.x;
    }
    else {
      ppBVar7 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x10),local_18);
      iVar4 = (*(*ppBVar7)->_vptr_Branching[10])();
      pLVar8 = Clause::operator[]((Clause *)CONCAT44(uVar9,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffbc);
      pLVar8->x = iVar4;
    }
    pLVar8 = Clause::operator[]((Clause *)CONCAT44(uVar9,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffd4.x = pLVar8->x;
    ::var(in_stack_ffffffffffffffd4);
    bVar2 = SAT::isRootLevel((SAT *)CONCAT44(in_stack_ffffffffffffffd4.x,in_stack_ffffffffffffffd0),
                             (int)((ulong)in_RDI >> 0x20));
    if (!bVar2) {
      bVar1 = false;
    }
    local_18 = local_18 + 1;
  }
  if (bVar1) {
    SAT::btToLevel((SAT *)CONCAT44(in_stack_ffffffffffffffd4.x,in_stack_ffffffffffffffd0),
                   (int)((ulong)in_RDI >> 0x20));
  }
  sat.confl = pCVar6;
  return;
}

Assistant:

void Engine::blockCurrentSol() {
	Clause& c = *Reason_new(outputs.size());
	bool root_failure = true;
	for (unsigned int i = 0; i < outputs.size(); i++) {
		Var* v = (Var*)outputs[i];
		if (v->getType() == BOOL_VAR) {
			c[i] = ((BoolView*)outputs[i])->getValLit();
		} else {
			c[i] = ((IntVar*)outputs[i])->getValLit();
		}
		if (!sat.isRootLevel(var(c[i]))) {
			root_failure = false;
		}
		assert(sat.value(c[i]) == l_False);
	}
	if (root_failure) {
		sat.btToLevel(0);
	}
	sat.confl = &c;
}